

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O3

bool __thiscall
spvtools::EnumSet<spvtools::Extension>::HasAnyOf
          (EnumSet<spvtools::Extension> *this,EnumSet<spvtools::Extension> *in_set)

{
  pointer pBVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  
  if (in_set->size_ == 0) {
    return true;
  }
  pBVar3 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar4 = (in_set->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (in_set->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar3 != pBVar1 && pBVar4 != pBVar2) {
    do {
      while (pBVar3->start != pBVar4->start) {
        if (pBVar4->start <= pBVar3->start) goto LAB_003080d4;
        pBVar3 = pBVar3 + 1;
        if (pBVar3 == pBVar1) {
          return false;
        }
      }
      if ((pBVar3->data & pBVar4->data) != 0) {
        return true;
      }
      pBVar3 = pBVar3 + 1;
LAB_003080d4:
    } while ((pBVar3 != pBVar1) && (pBVar4 = pBVar4 + 1, pBVar4 != pBVar2));
  }
  return false;
}

Assistant:

inline bool empty() const { return size_ == 0; }